

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O3

double * __thiscall fizplex::SVector::operator[](SVector *this,size_t ind)

{
  pointer pNVar1;
  double *pdVar2;
  long lVar3;
  
  pNVar1 = (this->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->values).
                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 4;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    pdVar2 = &pNVar1->value;
    do {
      if (((Nonzero *)(pdVar2 + -1))->index == ind) {
        return pdVar2;
      }
      pdVar2 = pdVar2 + 2;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  add_value(this,ind,0.0);
  return &(this->values).
          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].value;
}

Assistant:

double &SVector::operator[](size_t ind) {
  for (size_t i = 0; i < values.size(); ++i) {
    if (values[i].index == ind)
      return values[i].value;
  }
  add_value(ind, 0.0);
  return values.back().value;
}